

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

internal_node<immutable::vector<char,_false,_5>,_true> *
immutable::rrb_details::internal_node_create<immutable::vector<char,false,5>,true>(uint32_t len)

{
  internal_node<immutable::vector<char,_false,_5>,_true> *piVar1;
  internal_node<immutable::vector<char,_false,_5>,_true> *node;
  uint32_t len_local;
  
  piVar1 = (internal_node<immutable::vector<char,_false,_5>,_true> *)malloc((ulong)len * 8 + 0x20);
  piVar1->len = len;
  piVar1->type = INTERNAL_NODE;
  (piVar1->size_table).ptr = (rrb_size_table<true> *)0x0;
  piVar1->guid = 0;
  piVar1->child =
       (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *)
       (piVar1 + 1);
  memset(piVar1->child,0,(ulong)len << 3);
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_create(uint32_t len)
      {
      internal_node<T, atomic_ref_counting>* node = (internal_node<T, atomic_ref_counting>*)malloc(sizeof(internal_node<T, atomic_ref_counting>) + len * sizeof(ref<internal_node<T, atomic_ref_counting>>));
      node->len = len;
      node->type = INTERNAL_NODE;
      node->size_table.ptr = nullptr;
      node->guid = 0;
      node->child = (ref<internal_node<T, atomic_ref_counting>>*)((char*)node + sizeof(internal_node<T, atomic_ref_counting>));
      memset(node->child, 0, len * sizeof(ref<internal_node<T, atomic_ref_counting>>)); // init pointers to zero      
      return node;
      }